

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-command.c
# Opt level: O1

void do_cmd_redraw(void)

{
  player_upkeep *ppVar1;
  _Bool _Var2;
  loc_conflict in_RAX;
  loc_conflict target;
  loc_conflict local_18;
  
  local_18 = in_RAX;
  Term_flush();
  event_signal(EVENT_INPUT_FLUSH);
  if (character_dungeon == true) {
    verify_panel();
  }
  Term_xtra(L'\n',L'\0');
  if (character_dungeon == true) {
    ppVar1 = player->upkeep;
    ppVar1->notice = ppVar1->notice | 1;
    ppVar1->update = ppVar1->update | 0x277;
    ppVar1->redraw = ppVar1->redraw | 0xffbfff;
  }
  Term_clear();
  if (character_dungeon != true) goto LAB_001bd3a7;
  handle_stuff(player);
  if ((character_dungeon == true) && ((player->opts).opt[8] == true)) {
    _Var2 = target_sighted();
    if (!_Var2) goto LAB_001bd399;
    target_get(&local_18);
  }
  else {
LAB_001bd399:
    local_18.x = (player->grid).x;
    local_18.y = (player->grid).y;
  }
  move_cursor_relative(local_18.y,local_18.x);
LAB_001bd3a7:
  Term_redraw_all();
  return;
}

Assistant:

void do_cmd_redraw(void)
{
	/* Low level flush */
	Term_flush();

	/* Reset "inkey()" */
	event_signal(EVENT_INPUT_FLUSH);

	if (character_dungeon)
		verify_panel();

	/* Hack -- React to changes */
	Term_xtra(TERM_XTRA_REACT, 0);

	if (character_dungeon) {
		/* Combine the pack (later) */
		player->upkeep->notice |= (PN_COMBINE);

		/* Update torch, gear */
		player->upkeep->update |= (PU_TORCH | PU_INVEN);

		/* Update stuff */
		player->upkeep->update |= (PU_BONUS | PU_HP | PU_SPELLS);

		/* Fully update the visuals */
		player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

		/* Redraw everything */
		player->upkeep->redraw |= (PR_BASIC | PR_EXTRA | PR_MAP | PR_INVEN |
								   PR_EQUIP | PR_MESSAGE | PR_MONSTER |
								   PR_OBJECT | PR_MONLIST | PR_ITEMLIST);
	}

	/* Clear screen */
	Term_clear();

	if (character_dungeon) {
		/* Hack -- update */
		handle_stuff(player);

		/* Place the cursor on the player */
		if ((0 != character_dungeon) && OPT(player, show_target) &&
			target_sighted()) {
			struct loc target;
			target_get(&target);
			move_cursor_relative(target.y, target.x);
		} else {
			move_cursor_relative(player->grid.y, player->grid.x);
		}
	}

	/* Redraw every window */
	(void) Term_redraw_all();
}